

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O2

void __thiscall Fl_Window::flush(Fl_Window *this)

{
  if (this->i != (Fl_X *)0x0) {
    make_current(this);
    fl_clip_region(this->i->region);
    this->i->region = (Fl_Region)0x0;
    (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[2])(this);
    return;
  }
  return;
}

Assistant:

void Fl::add_clipboard_notify(Fl_Clipboard_Notify_Handler h, void *data) {
  struct Clipboard_Notify *node;

  remove_clipboard_notify(h);

  node = new Clipboard_Notify;

  node->handler = h;
  node->data = data;
  node->next = clip_notify_list;

  clip_notify_list = node;

  fl_clipboard_notify_change();
}